

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleModelUnitsDecimal(void)

{
  ON_UUID id_00;
  ON_DimStyle *in_RDI;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0x8b;
  id_00.Data4[1] = 0x97;
  id_00.Data4[2] = 0x93;
  id_00.Data4[3] = 'Y';
  id_00.Data4[4] = 0xf1;
  id_00.Data4[5] = 0xbd;
  id_00.Data4[6] = 0xed;
  id_00.Data4[7] = '\x17';
  id_00.Data1 = 0x93a38bdf;
  id_00.Data2 = 0x4c1c;
  id_00.Data3 = 0x428c;
  Internal_DimStyleInit(L"Model Units Decimal",-9,id_00,in_RDI);
  Internal_DimStyleModelUnitsDecimalInit(in_RDI);
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleModelUnitsDecimal()
{
  const ON_UUID id =
  { 0x93a38bdf, 0x4c1c, 0x428c, { 0x8b, 0x97, 0x93, 0x59, 0xf1, 0xbd, 0xed, 0x17 } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Model Units Decimal", -9, id, dimstyle);
  Internal_DimStyleModelUnitsDecimalInit(dimstyle);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}